

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.hpp
# Opt level: O3

void __thiscall
duckdb::roaring::ArrayContainerScanState<false>::Skip
          (ArrayContainerScanState<false> *this,idx_t to_skip)

{
  ulong uVar1;
  
  uVar1 = to_skip + (this->super_ContainerScanState).scanned_count;
  if (this->array_index != 0) goto LAB_0056b856;
  do {
    (*(this->super_ContainerScanState)._vptr_ContainerScanState[5])(this);
LAB_0056b856:
  } while ((this->finished == false) && (this->value < uVar1));
  (this->super_ContainerScanState).scanned_count = uVar1;
  return;
}

Assistant:

void Skip(idx_t to_skip) override {
		idx_t end = scanned_count + to_skip;
		if (!array_index) {
			LoadNextValue();
		}
		while (!finished && value < end) {
			LoadNextValue();
		}
		// In case array_index has already reached count
		scanned_count = end;
	}